

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_elements_issuance_generate_entropy
              (uchar *txhash,size_t txhash_len,uint32_t index,uchar *contract_hash,
              size_t contract_hash_len,uchar *bytes_out,size_t len)

{
  int iVar1;
  uchar buff_2 [36];
  uchar buff [64];
  
  if (len == 0x20 &&
      (bytes_out != (uchar *)0x0 &&
      ((contract_hash_len == 0x20 && txhash_len == 0x20) &&
      (contract_hash != (uchar *)0x0 && txhash != (uchar *)0x0)))) {
    buff_2._0_8_ = *(undefined8 *)txhash;
    buff_2._8_8_ = *(undefined8 *)(txhash + 8);
    buff_2._16_8_ = *(undefined8 *)(txhash + 0x10);
    buff_2._24_8_ = *(undefined8 *)(txhash + 0x18);
    buff_2._32_4_ = index;
    iVar1 = wally_sha256d(buff_2,0x24,buff,0x20);
    if (iVar1 == 0) {
      buff._32_8_ = *(undefined8 *)contract_hash;
      buff._40_8_ = *(undefined8 *)(contract_hash + 8);
      buff._48_8_ = *(undefined8 *)(contract_hash + 0x10);
      buff._56_8_ = *(undefined8 *)(contract_hash + 0x18);
      iVar1 = wally_sha256_midstate(buff,0x40,bytes_out,0x20);
    }
    wally_clear_2(buff,0x40,buff_2,0x24);
  }
  else {
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

int wally_tx_elements_issuance_generate_entropy(const unsigned char *txhash,
                                                size_t txhash_len,
                                                uint32_t index,
                                                const unsigned char *contract_hash,
                                                size_t contract_hash_len,
                                                unsigned char *bytes_out,
                                                size_t len)
{
    unsigned char buff[2 * SHA256_LEN];
    unsigned char buff_2[WALLY_TXHASH_LEN + sizeof(uint32_t)];
    int ret;

    if (!txhash || txhash_len != WALLY_TXHASH_LEN ||
        !contract_hash || contract_hash_len != SHA256_LEN ||
        !bytes_out || len != SHA256_LEN)
        return WALLY_EINVAL;

    memcpy(buff_2, txhash, txhash_len);
    uint32_to_le_bytes(index, buff_2 + txhash_len);

    ret = wally_sha256d(buff_2, sizeof(buff_2), buff, SHA256_LEN);
    if (ret == WALLY_OK) {
        memcpy(buff + SHA256_LEN, contract_hash, contract_hash_len);
        ret = wally_sha256_midstate(buff, sizeof(buff), bytes_out, len);
    }

    wally_clear_2(buff, sizeof(buff), buff_2, sizeof(buff_2));
    return ret;
}